

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonschema_draft7_tests.cpp
# Opt level: O3

json __thiscall anon_unknown.dwarf_41a7323::resolver(anon_unknown_dwarf_41a7323 *this,uri *uri)

{
  unsigned_long uVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *other;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  json jVar3;
  string pathname;
  fstream is;
  long *local_390 [2];
  long local_380 [2];
  undefined1 local_370 [32];
  byte abStack_350 [496];
  undefined1 local_160 [16];
  _Any_data local_150;
  _Manager_type local_140;
  undefined1 local_130 [64];
  basic_json_options_common<char> local_f0;
  
  local_390[0] = local_380;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_390,"./jsonschema/JSON-Schema-Test-Suite/remotes","");
  uVar1 = (uri->path_part_).first;
  local_160._8_8_ = (uri->uri_string_)._M_dataplus._M_p + uVar1;
  local_160._0_8_ = (uri->path_part_).second - uVar1;
  ::jsoncons::uri::decode_part_abi_cxx11_
            ((string *)local_370,(uri *)local_160,(string_view *)local_160._8_8_);
  std::__cxx11::string::_M_append((char *)local_390,local_370._0_8_);
  if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
    operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
  }
  std::fstream::fstream(local_370,(char *)local_390[0],_S_out|_S_in);
  if ((abStack_350[*(long *)(local_370._0_8_ + -0x18)] & 5) == 0) {
    memset((basic_json_options<char> *)local_160,0,0x148);
    ::jsoncons::basic_json_options<char>::basic_json_options((basic_json_options<char> *)local_160);
    ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::parse
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (basic_istream<char,_std::char_traits<char>_> *)local_370,
               (basic_json_decode_options<char> *)local_160);
    ::jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
              ((basic_json_encode_options<char> *)local_130,&PTR_construction_vtable_24__00b2faf8);
    local_160._0_8_ = &PTR__basic_json_decode_options_00b2fb30;
    local_f0._vptr_basic_json_options_common =
         (_func_int **)&PTR__basic_json_decode_options_00b2fb58;
    if (local_140 != (_Manager_type)0x0) {
      (*local_140)(&local_150,&local_150,__destroy_functor);
    }
    ::jsoncons::basic_json_options_common<char>::~basic_json_options_common(&local_f0);
  }
  else {
    other = ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,other);
  }
  std::fstream::~fstream(local_370);
  uVar2 = extraout_RDX;
  if (local_390[0] != local_380) {
    operator_delete(local_390[0],local_380[0] + 1);
    uVar2 = extraout_RDX_00;
  }
  jVar3.field_0.int64_.val_ = uVar2;
  jVar3.field_0._0_8_ = this;
  return (json)jVar3.field_0;
}

Assistant:

json resolver(const jsoncons::uri& uri)
    {
        //std::cout << uri.string() << ", " << uri.path() << "\n";
        std::string pathname = "./jsonschema/JSON-Schema-Test-Suite/remotes";
        pathname += std::string(uri.path());

        std::fstream is(pathname.c_str());
        if (!is)
        {
            return json::null();
        }

        return json::parse(is);
    }